

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

StrHash hash_sparse(uint64_t seed,char *str,MSize len)

{
  uint uVar1;
  uint local_48;
  uint local_44;
  StrHash h;
  StrHash b;
  StrHash a;
  MSize len_local;
  char *str_local;
  uint64_t seed_local;
  
  uVar1 = len ^ (uint)seed;
  if (len < 4) {
    h = (StrHash)(byte)*str;
    local_44 = (uint)(byte)str[len >> 1];
    local_48 = (local_44 ^ (byte)str[(ulong)len - 1] ^ uVar1) + local_44 * -0x4000;
  }
  else {
    h = *(StrHash *)str;
    local_44 = *(uint *)(str + ((ulong)(len >> 1) - 2));
    local_48 = (local_44 ^ *(uint *)(str + ((ulong)len - 4)) ^ uVar1) -
               (local_44 << 0xe | local_44 >> 0x12);
    local_44 = *(int *)(str + ((ulong)(len >> 2) - 1)) + local_44;
  }
  uVar1 = (local_48 ^ h) - (local_48 << 0xb | local_48 >> 0x15);
  uVar1 = (uVar1 ^ local_44) - (uVar1 * 0x2000000 | uVar1 >> 7);
  return (uVar1 ^ local_48) - (uVar1 * 0x10000 | uVar1 >> 0x10);
}

Assistant:

static StrHash hash_sparse(uint64_t seed, const char *str, MSize len)
{
  /* Constants taken from lookup3 hash by Bob Jenkins. */
  StrHash a, b, h = len ^ (StrHash)seed;
  if (len >= 4) {  /* Caveat: unaligned access! */
    a = lj_getu32(str);
    h ^= lj_getu32(str+len-4);
    b = lj_getu32(str+(len>>1)-2);
    h ^= b; h -= lj_rol(b, 14);
    b += lj_getu32(str+(len>>2)-1);
  } else {
    a = *(const uint8_t *)str;
    h ^= *(const uint8_t *)(str+len-1);
    b = *(const uint8_t *)(str+(len>>1));
    h ^= b; h -= lj_rol(b, 14);
  }
  a ^= h; a -= lj_rol(h, 11);
  b ^= a; b -= lj_rol(a, 25);
  h ^= b; h -= lj_rol(b, 16);
  return h;
}